

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matcher_test.cc
# Opt level: O0

void __thiscall
cpsm::testing::Matches::assert_match_index(Matches *this,string_ref item,size_type expected_index)

{
  string_ref item_00;
  basic_string_ref<char,_std::char_traits<char>_> args_1;
  TestAssertionFailure *args;
  undefined8 uVar1;
  TestAssertionFailure *in_RCX;
  char *in_RDX;
  size_t in_RSI;
  char *in_RDI;
  char *unaff_retaddr;
  unsigned_long in_stack_00000008;
  size_type index;
  Matches *in_stack_ffffffffffffffb0;
  char *in_stack_ffffffffffffffb8;
  size_t in_stack_ffffffffffffffc0;
  size_t sVar2;
  
  item_00.len_ = in_stack_ffffffffffffffc0;
  item_00.ptr_ = in_stack_ffffffffffffffb8;
  sVar2 = in_RSI;
  args = (TestAssertionFailure *)match_index(in_stack_ffffffffffffffb0,item_00);
  if (args != in_RCX) {
    uVar1 = __cxa_allocate_exception(0x28);
    args_1.len_ = sVar2;
    args_1.ptr_ = in_RDI;
    TestAssertionFailure::
    TestAssertionFailure<char_const*,boost::basic_string_ref<char,std::char_traits<char>>,char_const*,unsigned_long,char_const*,unsigned_long>
              (in_RCX,(char *)args,args_1,in_RDX,in_RSI,unaff_retaddr,in_stack_00000008);
    __cxa_throw(uVar1,&TestAssertionFailure::typeinfo,TestAssertionFailure::~TestAssertionFailure);
  }
  return;
}

Assistant:

void assert_match_index(boost::string_ref const item,
                          size_type const expected_index) const {
    auto const index = match_index(item);
    if (index != expected_index) {
      throw TestAssertionFailure("expected '", item, "' (index ", index,
                                 ") to have index ", expected_index);
    }
  }